

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3BestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  sqlite3_index_constraint *psVar1;
  sqlite3_index_constraint_usage *psVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  
  pInfo->idxNum = 0;
  pInfo->estimatedCost = 5000000.0;
  uVar13 = 0;
  uVar3 = pInfo->nConstraint;
  if (pInfo->nConstraint < 1) {
    uVar3 = 0;
  }
  uVar8 = 0xffffffff;
  lVar10 = 5;
  uVar12 = 0;
  uVar7 = 0xffffffff;
  uVar5 = 0xffffffff;
  uVar6 = 0xffffffff;
  do {
    if (uVar3 == uVar12) {
      if (uVar13 == 1) {
        *(byte *)&pInfo->idxFlags = (byte)pInfo->idxFlags | 1;
      }
      if ((int)uVar6 < 0) {
        iVar9 = 1;
      }
      else {
        psVar2 = pInfo->aConstraintUsage;
        psVar2[uVar6].argvIndex = 1;
        psVar2[uVar6].omit = '\x01';
        iVar9 = 2;
      }
      if (-1 < (int)uVar8) {
        uVar13 = uVar13 | 0x10000;
        pInfo->idxNum = uVar13;
        pInfo->aConstraintUsage[uVar8].argvIndex = iVar9;
        iVar9 = iVar9 + 1;
      }
      if (-1 < (int)uVar5) {
        uVar13 = uVar13 | 0x20000;
        pInfo->idxNum = uVar13;
        pInfo->aConstraintUsage[uVar5].argvIndex = iVar9;
        iVar9 = iVar9 + 1;
      }
      if (-1 < (int)uVar7) {
        pInfo->idxNum = uVar13 | 0x40000;
        pInfo->aConstraintUsage[uVar7].argvIndex = iVar9;
      }
      if (pInfo->nOrderBy == 1) {
        iVar9 = pInfo->aOrderBy->iColumn;
        if ((iVar9 < 0) || (iVar9 == *(int *)&pVTab[2].pModule + 1)) {
          pcVar4 = "DESC";
          if (pInfo->aOrderBy->desc == '\0') {
            pcVar4 = "ASC";
          }
          pInfo->idxStr = pcVar4;
          pInfo->orderByConsumed = 1;
        }
      }
      return 0;
    }
    psVar1 = pInfo->aConstraint;
    if (*(char *)((long)&psVar1->iColumn + lVar10) == '\0') {
      if (*(char *)((long)psVar1 + lVar10 + -1) == '@') {
        pInfo->idxNum = 0;
        pInfo->estimatedCost = 1e+50;
        pInfo->estimatedRows = 0x4000000000000;
        return 0;
      }
    }
    else {
      iVar9 = *(int *)((long)psVar1 + lVar10 + -5);
      if (iVar9 < 0) {
        bVar14 = true;
      }
      else {
        bVar14 = iVar9 == *(int *)&pVTab[2].pModule + 1;
      }
      bVar11 = *(byte *)((long)psVar1 + lVar10 + -1);
      if ((((int)uVar6 < 0) && (bVar11 == 2)) && (bVar14)) {
        pInfo->idxNum = 1;
        pInfo->estimatedCost = 1.0;
        uVar6 = uVar12 & 0xffffffff;
        uVar13 = 1;
LAB_001b5582:
        if (iVar9 == *(int *)&pVTab[2].pModule + 2) {
          uVar8 = uVar12 & 0xffffffff;
        }
        bVar11 = 2;
      }
      else {
        if (bVar11 == 2) goto LAB_001b5582;
        if (((bVar11 == 0x40) && (bVar11 = 0x40, -1 < iVar9)) &&
           (iVar9 <= *(int *)&pVTab[2].pModule)) {
          uVar13 = iVar9 + 2;
          pInfo->idxNum = uVar13;
          pInfo->estimatedCost = 2.0;
          uVar6 = uVar12 & 0xffffffff;
        }
      }
      if (bVar14) {
        switch((uint)bVar11 << 0x1e | bVar11 - 4 >> 2) {
        case 0:
        case 7:
          uVar5 = uVar12 & 0xffffffff;
          break;
        case 1:
        case 3:
          uVar7 = (uint)uVar12;
        }
      }
    }
    uVar12 = uVar12 + 1;
    lVar10 = lVar10 + 0xc;
  } while( true );
}

Assistant:

static int fts3BestIndexMethod(sqlite3_vtab *pVTab, sqlite3_index_info *pInfo){
  Fts3Table *p = (Fts3Table *)pVTab;
  int i;                          /* Iterator variable */
  int iCons = -1;                 /* Index of constraint to use */

  int iLangidCons = -1;           /* Index of langid=x constraint, if present */
  int iDocidGe = -1;              /* Index of docid>=x constraint, if present */
  int iDocidLe = -1;              /* Index of docid<=x constraint, if present */
  int iIdx;

  /* By default use a full table scan. This is an expensive option,
  ** so search through the constraints to see if a more efficient 
  ** strategy is possible.
  */
  pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
  pInfo->estimatedCost = 5000000;
  for(i=0; i<pInfo->nConstraint; i++){
    int bDocid;                 /* True if this constraint is on docid */
    struct sqlite3_index_constraint *pCons = &pInfo->aConstraint[i];
    if( pCons->usable==0 ){
      if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH ){
        /* There exists an unusable MATCH constraint. This means that if
        ** the planner does elect to use the results of this call as part
        ** of the overall query plan the user will see an "unable to use
        ** function MATCH in the requested context" error. To discourage
        ** this, return a very high cost here.  */
        pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
        pInfo->estimatedCost = 1e50;
        fts3SetEstimatedRows(pInfo, ((sqlite3_int64)1) << 50);
        return SQLITE_OK;
      }
      continue;
    }

    bDocid = (pCons->iColumn<0 || pCons->iColumn==p->nColumn+1);

    /* A direct lookup on the rowid or docid column. Assign a cost of 1.0. */
    if( iCons<0 && pCons->op==SQLITE_INDEX_CONSTRAINT_EQ && bDocid ){
      pInfo->idxNum = FTS3_DOCID_SEARCH;
      pInfo->estimatedCost = 1.0;
      iCons = i;
    }

    /* A MATCH constraint. Use a full-text search.
    **
    ** If there is more than one MATCH constraint available, use the first
    ** one encountered. If there is both a MATCH constraint and a direct
    ** rowid/docid lookup, prefer the MATCH strategy. This is done even 
    ** though the rowid/docid lookup is faster than a MATCH query, selecting
    ** it would lead to an "unable to use function MATCH in the requested 
    ** context" error.
    */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH 
     && pCons->iColumn>=0 && pCons->iColumn<=p->nColumn
    ){
      pInfo->idxNum = FTS3_FULLTEXT_SEARCH + pCons->iColumn;
      pInfo->estimatedCost = 2.0;
      iCons = i;
    }

    /* Equality constraint on the langid column */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_EQ 
     && pCons->iColumn==p->nColumn + 2
    ){
      iLangidCons = i;
    }

    if( bDocid ){
      switch( pCons->op ){
        case SQLITE_INDEX_CONSTRAINT_GE:
        case SQLITE_INDEX_CONSTRAINT_GT:
          iDocidGe = i;
          break;

        case SQLITE_INDEX_CONSTRAINT_LE:
        case SQLITE_INDEX_CONSTRAINT_LT:
          iDocidLe = i;
          break;
      }
    }
  }

  /* If using a docid=? or rowid=? strategy, set the UNIQUE flag. */
  if( pInfo->idxNum==FTS3_DOCID_SEARCH ) fts3SetUniqueFlag(pInfo);

  iIdx = 1;
  if( iCons>=0 ){
    pInfo->aConstraintUsage[iCons].argvIndex = iIdx++;
    pInfo->aConstraintUsage[iCons].omit = 1;
  } 
  if( iLangidCons>=0 ){
    pInfo->idxNum |= FTS3_HAVE_LANGID;
    pInfo->aConstraintUsage[iLangidCons].argvIndex = iIdx++;
  } 
  if( iDocidGe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_GE;
    pInfo->aConstraintUsage[iDocidGe].argvIndex = iIdx++;
  } 
  if( iDocidLe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_LE;
    pInfo->aConstraintUsage[iDocidLe].argvIndex = iIdx++;
  } 

  /* Regardless of the strategy selected, FTS can deliver rows in rowid (or
  ** docid) order. Both ascending and descending are possible. 
  */
  if( pInfo->nOrderBy==1 ){
    struct sqlite3_index_orderby *pOrder = &pInfo->aOrderBy[0];
    if( pOrder->iColumn<0 || pOrder->iColumn==p->nColumn+1 ){
      if( pOrder->desc ){
        pInfo->idxStr = "DESC";
      }else{
        pInfo->idxStr = "ASC";
      }
      pInfo->orderByConsumed = 1;
    }
  }

  assert( p->pSegments==0 );
  return SQLITE_OK;
}